

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq_word_validation_test.c
# Opt level: O0

char * get_following_states(automaton *a,char state,char word_letter)

{
  char word_letter_local;
  char state_local;
  automaton *a_local;
  
  return a->transitions
         [(long)(char)(state + -1) * a->alphabet_size + (long)(char)(word_letter + -0x61)];
}

Assistant:

const char * get_following_states(const automaton * a, char state, char word_letter) {
    assert(state >= 0 + STR_STORAGE_VAL_OFFSET);
    assert(state < a->states_size + STR_STORAGE_VAL_OFFSET);
    assert(word_letter >= 'a');
    assert(word_letter <= 'z');

    state -= STR_STORAGE_VAL_OFFSET;
    word_letter -= 'a';
    return a->transitions[state*a->alphabet_size + word_letter];
}